

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O3

void __thiscall TestClass::~TestClass(TestClass *this)

{
  ~TestClass(this);
  operator_delete(this,0x2c0);
  return;
}

Assistant:

TestClass::~TestClass()
{
	delete mEvent1Handler;
	delete mEvent2Handler;
	delete mEvent3Handler;
	
	mThread.removeAll();
	TimerManager::destroyManager();
}